

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O3

utf8proc_ssize_t
duckdb::utf8proc_decompose_custom
          (utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
          utf8proc_ssize_t bufsize,utf8proc_option_t options,utf8proc_custom_func custom_func,
          void *custom_data)

{
  uint uVar1;
  uint uVar2;
  utf8proc_ssize_t uVar3;
  long lVar4;
  utf8proc_int32_t *dst;
  long lVar5;
  long lVar6;
  utf8proc_int32_t uc;
  int local_54;
  utf8proc_option_t local_50;
  int local_4c;
  utf8proc_ssize_t local_48;
  utf8proc_uint8_t *local_40;
  long local_38;
  
  local_50 = options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE);
  uVar3 = -5;
  if ((options & (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != UTF8PROC_STRIPMARK &&
      local_50 != (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) {
    local_4c = 0;
    lVar6 = 0;
    lVar4 = 0;
    local_48 = bufsize;
    local_40 = str;
    local_38 = strlen;
    do {
      if ((options & UTF8PROC_NULLTERM) == 0) {
        if (local_38 - lVar6 == 0 || local_38 < lVar6) {
LAB_0022838e:
          if (local_50 == 0) {
            return lVar4;
          }
          if (lVar4 <= local_48) {
            if (1 < lVar4) {
              lVar6 = 0;
              do {
                uVar1 = buffer[lVar6];
                uVar2 = buffer[lVar6 + 1];
                lVar5 = lVar6 + 1;
                if ((*(short *)(&DAT_012b5162 +
                               (ulong)*(ushort *)
                                       (&utf8proc_stage2table +
                                       (ulong)((uVar2 & 0xff) +
                                              (uint)(ushort)(&utf8proc_stage1table)[(int)uVar2 >> 8]
                                              ) * 2) * 0x18) <
                     *(short *)(&DAT_012b5162 +
                               (ulong)*(ushort *)
                                       (&utf8proc_stage2table +
                                       (ulong)((uVar1 & 0xff) +
                                              (uint)(ushort)(&utf8proc_stage1table)[(int)uVar1 >> 8]
                                              ) * 2) * 0x18)) &&
                   (0 < *(short *)(&DAT_012b5162 +
                                  (ulong)*(ushort *)
                                          (&utf8proc_stage2table +
                                          (ulong)((uVar2 & 0xff) +
                                                 (uint)(ushort)(&utf8proc_stage1table)
                                                               [(int)uVar2 >> 8]) * 2) * 0x18))) {
                  buffer[lVar6] = uVar2;
                  buffer[lVar6 + 1] = uVar1;
                  if (0 < lVar6) {
                    lVar5 = lVar6 + -1;
                  }
                }
                lVar6 = lVar5;
              } while (lVar5 < lVar4 + -1);
              return lVar4;
            }
            return lVar4;
          }
          return lVar4;
        }
        uVar3 = utf8proc_iterate(local_40 + lVar6,local_38 - lVar6,&local_54);
        if (local_54 < 0) {
          return -3;
        }
        lVar6 = uVar3 + lVar6;
      }
      else {
        uVar3 = utf8proc_iterate(local_40 + lVar6,-1,&local_54);
        if (local_54 < 0) {
          return -3;
        }
        lVar6 = uVar3 + lVar6;
        if (lVar6 < 0) break;
        if (local_54 == 0) goto LAB_0022838e;
      }
      if (custom_func != (utf8proc_custom_func)0x0) {
        local_54 = (*custom_func)(local_54,custom_data);
      }
      dst = buffer + lVar4;
      if (buffer == (utf8proc_int32_t *)0x0) {
        dst = (utf8proc_int32_t *)0x0;
      }
      uVar3 = local_48 - lVar4;
      if (uVar3 == 0 || local_48 < lVar4) {
        uVar3 = 0;
      }
      uVar3 = utf8proc_decompose_char(local_54,dst,uVar3,options,&local_4c);
      if (uVar3 < 0) {
        return uVar3;
      }
      lVar4 = lVar4 + uVar3;
    } while (lVar4 < 0x1000000000000000);
    uVar3 = -2;
  }
  return uVar3;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_custom(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options,
  utf8proc_custom_func custom_func, void *custom_data
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      if (custom_func != NULL) {
        uc = custom_func(uc, custom_data);   /* user-specified custom mapping */
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer ? buffer + wpos : nullptr, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
          } else {
            pos++;
          }
    }
  }
  return wpos;
}